

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExact.c
# Opt level: O1

int cuddExact(DdManager *table,int lower,int upper)

{
  DdHalfWord DVar1;
  uint uVar2;
  DdSubtable *pDVar3;
  DdHalfWord *pDVar4;
  int *piVar5;
  bool bVar6;
  uint uVar7;
  DdHalfWord **ppDVar8;
  DdHalfWord tmp;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar14;
  DdHalfWord **matrix;
  uint *puVar15;
  DdHalfWord *permutation;
  void *__ptr;
  int iVar16;
  uint uVar17;
  int iVar18;
  DdHalfWord DVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  DdHalfWord *pDVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  uint cols;
  ulong uVar30;
  uint *puVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  uint uVar37;
  long lVar38;
  ulong uVar39;
  uint uVar40;
  ulong uVar41;
  int iVar42;
  ulong uVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  int size;
  int local_184;
  uint local_17c;
  DdHalfWord *local_160;
  DdHalfWord **local_148;
  uint *local_140;
  long local_c8;
  long local_c0;
  DdHalfWord *local_b8;
  long local_a8;
  ulong uVar13;
  
  uVar28 = (ulong)(uint)upper;
  pDVar3 = table->subtables;
  uVar39 = (ulong)lower;
  uVar43 = (ulong)upper;
  if (pDVar3[uVar39].keys == 1) {
    puVar15 = &pDVar3[uVar39 + 1].keys;
    do {
      if (((long)upper <= (long)uVar39) || (table->vars[table->invperm[uVar39]]->ref != 1)) break;
      uVar39 = uVar39 + 1;
      uVar40 = *puVar15;
      puVar15 = puVar15 + 0xe;
    } while (uVar40 == 1);
    uVar41 = uVar39 & 0xffffffff;
  }
  else {
    uVar41 = (ulong)(uint)lower;
  }
  uVar40 = (uint)uVar41;
  if (pDVar3[uVar43].keys == 1) {
    puVar15 = &pDVar3[uVar43 - 1].keys;
    do {
      if (((long)uVar43 <= (long)(int)uVar40) || (table->vars[table->invperm[uVar43]]->ref != 1))
      break;
      uVar43 = uVar43 - 1;
      uVar27 = *puVar15;
      puVar15 = puVar15 + -0xe;
    } while (uVar27 == 1);
    uVar28 = uVar43 & 0xffffffff;
  }
  uVar27 = (uint)uVar28;
  iVar16 = uVar40 - uVar27;
  if (iVar16 == 0) {
    return 1;
  }
  iVar9 = cuddSymmSiftingConv(table,uVar40,uVar27);
  iVar42 = 0;
  if (iVar9 != 0) {
    uVar10 = uVar27 - uVar40;
    uVar13 = (ulong)uVar10;
    cols = uVar10 + 1;
    if ((int)(uVar40 + 1) < (int)uVar27) {
      lVar14 = (long)(int)(uVar40 + 1);
      puVar15 = &table->subtables[lVar14].keys;
      iVar9 = ~uVar40 + uVar27;
      iVar42 = 0;
      do {
        if (*puVar15 == 1) {
          iVar42 = iVar42 + (uint)(table->vars[table->invperm[lVar14]]->ref == 1);
        }
        lVar14 = lVar14 + 1;
        puVar15 = puVar15 + 0xe;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    uVar11 = cols - iVar42;
    iVar9 = -1;
    if ((uVar11 < 0x22) && (iVar9 = 1, 1 < (int)uVar11)) {
      uVar17 = uVar11 + 3 >> 1;
      dVar44 = (double)uVar17;
      dVar45 = (double)(int)(uVar17 + 1);
      if (dVar45 <= (double)(int)uVar11) {
        dVar46 = 2.0;
        do {
          dVar44 = (dVar44 * dVar45) / dVar46;
          dVar45 = dVar45 + 1.0;
          dVar46 = dVar46 + 1.0;
        } while (dVar45 <= (double)(int)uVar11);
      }
      iVar9 = (int)dVar44;
    }
    if (iVar9 != -1) {
      iVar42 = table->size;
      local_148 = getMatrix(iVar9,cols);
      if (local_148 != (DdHalfWord **)0x0) {
        local_140 = (uint *)malloc((long)iVar9 << 2);
        if (local_140 == (uint *)0x0) {
          local_140 = (uint *)0x0;
        }
        else {
          matrix = getMatrix(iVar9,cols);
          if (matrix != (DdHalfWord **)0x0) {
            puVar15 = (uint *)malloc((long)iVar9 << 2);
            if (puVar15 == (uint *)0x0) {
              puVar15 = (uint *)0x0;
LAB_0077bdaa:
              __ptr = (void *)0x0;
              permutation = (DdHalfWord *)0x0;
            }
            else {
              lVar14 = (long)(int)cols;
              permutation = (DdHalfWord *)malloc(lVar14 * 4);
              if (permutation == (DdHalfWord *)0x0) goto LAB_0077bdaa;
              __ptr = malloc((long)iVar42);
              if (__ptr == (void *)0x0) {
                __ptr = (void *)0x0;
              }
              else {
                local_160 = initSymmInfo(table,uVar40,uVar27);
                if (local_160 != (DdHalfWord *)0x0) {
                  iVar9 = ddCountRoots(table,uVar40,uVar27);
                  if (-1 < (int)uVar10) {
                    pDVar4 = *matrix;
                    piVar5 = table->invperm;
                    uVar30 = 0;
                    do {
                      DVar1 = piVar5[(long)(int)uVar40 + uVar30];
                      permutation[uVar30] = DVar1;
                      pDVar4[uVar30] = DVar1;
                      uVar30 = uVar30 + 1;
                    } while ((uVar27 - uVar40) + 1 != uVar30);
                  }
                  uVar11 = (table->constants).keys;
                  iVar22 = uVar27 + 1;
                  if (iVar22 < iVar42) {
                    puVar31 = &table->subtables[iVar22].keys;
                    lVar38 = 0;
                    do {
                      uVar11 = (uVar11 - (table->vars[table->invperm[iVar22 + lVar38]]->ref == 1)) +
                               *puVar31;
                      lVar38 = lVar38 + 1;
                      puVar31 = puVar31 + 0xe;
                    } while (~uVar27 + iVar42 != (int)lVar38);
                  }
                  *puVar15 = uVar11;
                  ppDVar8 = matrix;
                  if (uVar10 < 0x7fffffff) {
                    local_184 = table->keys - table->isolated;
                    local_17c = 1;
                    uVar10 = 1;
                    if (1 < (int)cols) {
                      uVar10 = cols;
                    }
                    iVar42 = (uVar27 - (int)uVar39) + 1;
                    local_a8 = lVar14 * 4;
                    uVar29 = 1;
                    local_c8 = -1;
                    uVar30 = uVar13;
                    do {
                      puVar31 = puVar15;
                      matrix = ppDVar8;
                      local_a8 = local_a8 + -4;
                      uVar17 = (uint)uVar28;
                      uVar11 = uVar17;
                      if ((int)uVar17 < (int)uVar40) {
                        uVar11 = uVar40;
                      }
                      uVar28 = (ulong)local_17c;
                      if ((int)local_17c < 1) {
                        local_17c = 0;
                      }
                      else {
                        lVar25 = (long)(int)uVar30;
                        lVar38 = lVar14 - uVar29;
                        uVar7 = (uint)lVar38;
                        iVar23 = uVar7 + uVar40;
                        iVar22 = uVar7 + uVar40 + 1;
                        uVar21 = 0;
                        local_17c = 0;
                        do {
                          uVar2 = puVar31[uVar21];
                          uVar12 = uVar2;
                          if (0 < (int)uVar40) {
                            puVar15 = &table->subtables->keys;
                            uVar33 = 0;
                            do {
                              uVar12 = (uVar12 + *puVar15) -
                                       (uint)(table->vars[table->invperm[uVar33]]->ref == 1);
                              uVar33 = uVar33 + 1;
                              puVar15 = puVar15 + 0xe;
                            } while (uVar41 != uVar33);
                          }
                          pDVar4 = matrix[uVar21];
                          iVar24 = 0;
                          iVar18 = 0;
                          if (-1 < lVar38) {
                            puVar15 = &table->subtables[uVar39].keys;
                            lVar34 = 0;
                            iVar18 = 0;
                            do {
                              uVar37 = 1;
                              if (*puVar15 < 2) {
                                uVar37 = (uint)(1 < table->vars[pDVar4[lVar34]]->ref);
                              }
                              iVar18 = iVar18 + uVar37;
                              lVar34 = lVar34 + 1;
                              puVar15 = puVar15 + 0xe;
                            } while (uVar11 + (1 - (int)uVar39) != (int)lVar34);
                          }
                          if (iVar22 < table->size) {
                            if (iVar23 < (int)uVar27) {
                              uVar33 = (ulong)pDVar4[lVar38 + 1];
                            }
                            else {
                              uVar33 = (ulong)table->invperm[uVar43 + 1];
                            }
                            iVar24 = (((table->vars[uVar33]->ref < 2) - 1) - iVar9) +
                                     table->subtables[iVar22].keys;
                          }
                          if (iVar24 < iVar18) {
                            iVar24 = iVar18;
                          }
                          if ((int)(iVar24 + uVar12) < local_184) {
                            iVar24 = ddShuffle(table,pDVar4,uVar40,uVar27);
                            puVar15 = puVar31;
                            if (iVar24 == 0) goto LAB_0077bcd9;
                            iVar24 = table->keys - table->isolated;
                            if ((iVar24 < local_184) &&
                               (local_184 = iVar24, (int)uVar40 <= (int)uVar27)) {
                              piVar5 = table->invperm;
                              lVar34 = 0;
                              do {
                                permutation[lVar34] = piVar5[uVar39 + lVar34];
                                lVar34 = lVar34 + 1;
                              } while (iVar42 != (int)lVar34);
                            }
                            if (-1 < lVar38) {
                              local_b8 = pDVar4 + lVar25;
                              lVar34 = lVar25;
                              local_c0 = lVar25 << 0x20;
                              do {
                                iVar18 = (uVar40 - 1) + (int)lVar34;
                                iVar24 = local_184;
                                if ((table->subtables[iVar18].keys != 1) ||
                                   (table->vars[table->invperm[iVar18]]->ref != 1)) {
                                  piVar5 = table->invperm;
                                  DVar1 = table->vars[piVar5[iVar23]]->ref;
                                  uVar12 = table->subtables[iVar23].keys;
                                  if ((int)uVar40 <= (int)uVar27) {
                                    lVar35 = 0;
                                    do {
                                      *(undefined1 *)((long)__ptr + (long)piVar5[uVar39 + lVar35]) =
                                           0;
                                      lVar35 = lVar35 + 1;
                                    } while (iVar42 != (int)lVar35);
                                  }
                                  lVar35 = local_c8;
                                  if (lVar38 <= (long)uVar13) {
                                    do {
                                      *(undefined1 *)((long)__ptr + (ulong)pDVar4[lVar14 + lVar35])
                                           = 1;
                                      lVar35 = lVar35 + 1;
                                    } while ((int)lVar35 != 0);
                                  }
                                  if ((int)local_17c < 1) {
                                    uVar33 = 0;
                                  }
                                  else {
                                    uVar33 = 0;
                                    do {
                                      uVar37 = uVar7;
                                      if (lVar38 <= (long)uVar13) {
                                        lVar35 = 0;
                                        do {
                                          if (*(char *)((long)__ptr +
                                                       (ulong)*(uint *)((long)local_148[uVar33] +
                                                                       lVar35 * 4 + local_a8)) ==
                                              '\0') {
                                            uVar37 = (int)lVar35 - iVar16;
                                            break;
                                          }
                                          lVar35 = lVar35 + 1;
                                          uVar37 = cols;
                                        } while ((int)uVar29 != (int)lVar35);
                                      }
                                      if (uVar37 == cols) goto LAB_0077c387;
                                      uVar33 = uVar33 + 1;
                                    } while (uVar33 != local_17c);
                                    uVar33 = (ulong)local_17c;
                                  }
LAB_0077c387:
                                  uVar12 = (uVar12 + uVar2) - (uint)(DVar1 == 1);
                                  uVar20 = uVar33 & 0xffffffff;
                                  if (((uint)uVar33 == local_17c) ||
                                     ((int)uVar12 < (int)local_140[uVar20])) {
                                    pDVar26 = local_148[uVar20];
                                    uVar36 = 0;
                                    do {
                                      pDVar26[uVar36] = pDVar4[uVar36];
                                      uVar36 = uVar36 + 1;
                                    } while (cols != uVar36);
                                    local_140[uVar20] = uVar12;
                                    local_17c = local_17c + ((uint)uVar33 == local_17c);
                                  }
                                  if (lVar34 == 0) break;
                                  DVar1 = pDVar4[lVar34 + -1];
                                  for (DVar19 = local_160[(int)DVar1]; DVar19 != DVar1;
                                      DVar19 = local_160[(int)DVar19]) {
                                    if (((int)DVar1 < (int)DVar19) &&
                                       (table->perm[(int)DVar19] <= lVar38)) goto LAB_0077c518;
                                  }
                                  lVar35 = local_c0;
                                  pDVar26 = local_b8;
                                  if (lVar34 <= lVar38) {
                                    do {
                                      pDVar26[-1] = *pDVar26;
                                      lVar32 = lVar35 >> 0x20;
                                      lVar35 = lVar35 + 0x100000000;
                                      pDVar26 = pDVar26 + 1;
                                    } while (lVar32 < lVar38);
                                  }
                                  pDVar4[lVar38] = DVar1;
                                  iVar18 = ddShuffle(table,pDVar4,uVar40,uVar27);
                                  if (iVar18 == 0) goto LAB_0077bcd9;
                                  iVar18 = table->keys - table->isolated;
                                  if (iVar18 < local_184) {
                                    iVar24 = iVar18;
                                  }
                                  if (((int)uVar40 <= (int)uVar27) && (iVar18 < local_184)) {
                                    piVar5 = table->invperm;
                                    lVar35 = 0;
                                    do {
                                      permutation[lVar35] = piVar5[uVar39 + lVar35];
                                      lVar35 = lVar35 + 1;
                                      iVar24 = iVar18;
                                    } while (iVar42 != (int)lVar35);
                                  }
                                }
LAB_0077c518:
                                local_184 = iVar24;
                                local_b8 = local_b8 + -1;
                                local_c0 = local_c0 + -0x100000000;
                                bVar6 = 0 < lVar34;
                                lVar34 = lVar34 + -1;
                              } while (bVar6);
                            }
                          }
                          uVar21 = uVar21 + 1;
                        } while (uVar21 != uVar28);
                      }
                      uVar29 = uVar29 + 1;
                      uVar30 = (ulong)((int)uVar30 - 1);
                      uVar28 = (ulong)(uVar17 - 1);
                      local_c8 = local_c8 + -1;
                      iVar16 = iVar16 + 1;
                      puVar15 = local_140;
                      ppDVar8 = local_148;
                      local_148 = matrix;
                      local_140 = puVar31;
                    } while (uVar29 != uVar10 + 1);
                  }
                  matrix = ppDVar8;
                  iVar16 = ddShuffle(table,permutation,uVar40,uVar27);
                  if (iVar16 != 0) {
                    freeMatrix(local_148);
                    freeMatrix(matrix);
                    free(permutation);
                    free(puVar15);
                    free(local_140);
                    free(local_160);
                    free(__ptr);
                    return 1;
                  }
                  goto LAB_0077bcd9;
                }
              }
            }
            local_160 = (DdHalfWord *)0x0;
            goto LAB_0077bcd9;
          }
        }
        local_160 = (DdHalfWord *)0x0;
        permutation = (DdHalfWord *)0x0;
        __ptr = (void *)0x0;
        matrix = (DdHalfWord **)0x0;
        puVar15 = (uint *)0x0;
        goto LAB_0077bcd9;
      }
    }
  }
  __ptr = (void *)0x0;
  local_160 = (DdHalfWord *)0x0;
  local_148 = (DdHalfWord **)0x0;
  matrix = (DdHalfWord **)0x0;
  local_140 = (uint *)0x0;
  permutation = (DdHalfWord *)0x0;
  puVar15 = (uint *)0x0;
LAB_0077bcd9:
  if (local_148 != (DdHalfWord **)0x0) {
    freeMatrix(local_148);
  }
  if (matrix != (DdHalfWord **)0x0) {
    freeMatrix(matrix);
  }
  if (permutation != (DdHalfWord *)0x0) {
    free(permutation);
  }
  if (puVar15 != (uint *)0x0) {
    free(puVar15);
  }
  if (local_140 != (uint *)0x0) {
    free(local_140);
  }
  if (local_160 != (DdHalfWord *)0x0) {
    free(local_160);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  table->errorCode = CUDD_MEMORY_OUT;
  return 0;
}

Assistant:

int
cuddExact(
  DdManager * table,
  int  lower,
  int  upper)
{
    int k, i, j;
    int maxBinomial, oldSubsets, newSubsets;
    int subsetCost;
    int size;                   /* number of variables to be reordered */
    int unused, nvars, level, result;
    int upperBound, lowerBound, cost;
    int roots;
    char *mask = NULL;
    DdHalfWord  *symmInfo = NULL;
    DdHalfWord **newOrder = NULL;
    DdHalfWord **oldOrder = NULL;
    int *newCost = NULL;
    int *oldCost = NULL;
    DdHalfWord **tmpOrder;
    int *tmpCost;
    DdHalfWord *bestOrder = NULL;
    DdHalfWord *order;
#ifdef DD_STATS
    int  ddTotalSubsets;
#endif

    /* Restrict the range to be reordered by excluding unused variables
    ** at the two ends. */
    while (table->subtables[lower].keys == 1 &&
           table->vars[table->invperm[lower]]->ref == 1 &&
           lower < upper)
        lower++;
    while (table->subtables[upper].keys == 1 &&
           table->vars[table->invperm[upper]]->ref == 1 &&
           lower < upper)
        upper--;
    if (lower == upper) return(1); /* trivial problem */

    /* Apply symmetric sifting to get a good upper bound and to extract
    ** symmetry information. */
    result = cuddSymmSiftingConv(table,lower,upper);
    if (result == 0) goto cuddExactOutOfMem;

#ifdef DD_STATS
    (void) fprintf(table->out,"\n");
    ddTotalShuffles = 0;
    ddTotalSubsets = 0;
#endif

    /* Initialization. */
    nvars = table->size;
    size = upper - lower + 1;
    /* Count unused variable among those to be reordered.  This is only
    ** used to compute maxBinomial. */
    unused = 0;
    for (i = lower + 1; i < upper; i++) {
        if (table->subtables[i].keys == 1 &&
            table->vars[table->invperm[i]]->ref == 1)
            unused++;
    }

    /* Find the maximum number of subsets we may have to store. */
    maxBinomial = getMaxBinomial(size - unused);
    if (maxBinomial == -1) goto cuddExactOutOfMem;

    newOrder = getMatrix(maxBinomial, size);
    if (newOrder == NULL) goto cuddExactOutOfMem;

    newCost = ABC_ALLOC(int, maxBinomial);
    if (newCost == NULL) goto cuddExactOutOfMem;

    oldOrder = getMatrix(maxBinomial, size);
    if (oldOrder == NULL) goto cuddExactOutOfMem;

    oldCost = ABC_ALLOC(int, maxBinomial);
    if (oldCost == NULL) goto cuddExactOutOfMem;

    bestOrder = ABC_ALLOC(DdHalfWord, size);
    if (bestOrder == NULL) goto cuddExactOutOfMem;

    mask = ABC_ALLOC(char, nvars);
    if (mask == NULL) goto cuddExactOutOfMem;

    symmInfo = initSymmInfo(table, lower, upper);
    if (symmInfo == NULL) goto cuddExactOutOfMem;

    roots = ddCountRoots(table, lower, upper);

    /* Initialize the old order matrix for the empty subset and the best
    ** order to the current order. The cost for the empty subset includes
    ** the cost of the levels between upper and the constants. These levels
    ** are not going to change. Hence, we count them only once.
    */
    oldSubsets = 1;
    for (i = 0; i < size; i++) {
        oldOrder[0][i] = bestOrder[i] = (DdHalfWord) table->invperm[i+lower];
    }
    subsetCost = table->constants.keys;
    for (i = upper + 1; i < nvars; i++)
        subsetCost += getLevelKeys(table,i);
    oldCost[0] = subsetCost;
    /* The upper bound is initialized to the current size of the BDDs. */
    upperBound = table->keys - table->isolated;

    /* Now consider subsets of increasing size. */
    for (k = 1; k <= size; k++) {
#ifdef DD_STATS
        (void) fprintf(table->out,"Processing subsets of size %d\n", k);
        fflush(table->out);
#endif
        newSubsets = 0;
        level = size - k;               /* offset of first bottom variable */

        for (i = 0; i < oldSubsets; i++) { /* for each subset of size k-1 */
            order = oldOrder[i];
            cost = oldCost[i];
            lowerBound = computeLB(table, order, roots, cost, lower, upper,
                                   level);
            if (lowerBound >= upperBound)
                continue;
            /* Impose new order. */
            result = ddShuffle(table, order, lower, upper);
            if (result == 0) goto cuddExactOutOfMem;
            upperBound = updateUB(table,upperBound,bestOrder,lower,upper);
            /* For each top bottom variable. */
            for (j = level; j >= 0; j--) {
                /* Skip unused variables. */
                if (table->subtables[j+lower-1].keys == 1 &&
                    table->vars[table->invperm[j+lower-1]]->ref == 1) continue;
                /* Find cost under this order. */
                subsetCost = cost + getLevelKeys(table, lower + level);
                newSubsets = updateEntry(table, order, level, subsetCost,
                                         newOrder, newCost, newSubsets, mask,
                                         lower, upper);
                if (j == 0)
                    break;
                if (checkSymmInfo(table, symmInfo, order[j-1], level) == 0)
                    continue;
                pushDown(order,j-1,level);
                /* Impose new order. */
                result = ddShuffle(table, order, lower, upper);
                if (result == 0) goto cuddExactOutOfMem;
                upperBound = updateUB(table,upperBound,bestOrder,lower,upper);
            } /* for each bottom variable */
        } /* for each subset of size k */

        /* New orders become old orders in preparation for next iteration. */
        tmpOrder = oldOrder; tmpCost = oldCost;
        oldOrder = newOrder; oldCost = newCost;
        newOrder = tmpOrder; newCost = tmpCost;
#ifdef DD_STATS
        ddTotalSubsets += newSubsets;
#endif
        oldSubsets = newSubsets;
    }
    result = ddShuffle(table, bestOrder, lower, upper);
    if (result == 0) goto cuddExactOutOfMem;
#ifdef DD_STATS
#ifdef DD_VERBOSE
    (void) fprintf(table->out,"\n");
#endif
    (void) fprintf(table->out,"#:S_EXACT   %8d: total subsets\n",
                   ddTotalSubsets);
    (void) fprintf(table->out,"#:H_EXACT   %8d: total shuffles",
                   ddTotalShuffles);
#endif

    freeMatrix(newOrder);
    freeMatrix(oldOrder);
    ABC_FREE(bestOrder);
    ABC_FREE(oldCost);
    ABC_FREE(newCost);
    ABC_FREE(symmInfo);
    ABC_FREE(mask);
    return(1);

cuddExactOutOfMem:

    if (newOrder != NULL) freeMatrix(newOrder);
    if (oldOrder != NULL) freeMatrix(oldOrder);
    if (bestOrder != NULL) ABC_FREE(bestOrder);
    if (oldCost != NULL) ABC_FREE(oldCost);
    if (newCost != NULL) ABC_FREE(newCost);
    if (symmInfo != NULL) ABC_FREE(symmInfo);
    if (mask != NULL) ABC_FREE(mask);
    table->errorCode = CUDD_MEMORY_OUT;
    return(0);

}